

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batch_helper.cxx
# Opt level: O1

void __thiscall
batch_helper::make_target_name(batch_helper *this,string *target,char *source,char *extension)

{
  string name;
  string folder;
  string local_70;
  string local_50;
  
  if ((this->m_output_file)._M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)target);
    return;
  }
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  xray_re::xr_file_system::split_path(source,&local_50,&local_70,(string *)0x0);
  std::__cxx11::string::_M_assign((string *)target);
  std::__cxx11::string::_M_append((char *)target,(ulong)local_70._M_dataplus._M_p);
  std::__cxx11::string::append((char *)target);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void batch_helper::make_target_name(std::string& target, const char* source, const char* extension) const
{
	if (m_output_file.empty()) {
		std::string name, folder;
		xr_file_system::split_path(source, &folder, &name);
		target = m_output_folder.empty() ? folder : m_output_folder;
		target += name;
		target += extension;
	} else {
		target = m_output_file;
	}
}